

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall RealCommandRunner::RealCommandRunner(RealCommandRunner *this,BuildConfig *config)

{
  BuildConfig *config_local;
  RealCommandRunner *this_local;
  
  CommandRunner::CommandRunner(&this->super_CommandRunner);
  (this->super_CommandRunner)._vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_00175af0;
  this->config_ = config;
  SubprocessSet::SubprocessSet(&this->subprocs_);
  std::
  map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
  ::map(&this->subproc_to_edge_);
  return;
}

Assistant:

explicit RealCommandRunner(const BuildConfig& config) : config_(config) {}